

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
::
copy_or_move_from<google::dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>>
          (dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
           *this,dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                 *ht,size_type min_buckets_wanted)

{
  pointer ppVar1;
  size_type sVar2;
  long lVar3;
  pair<const_int,_A> *value;
  size_type new_num_buckets;
  pointer ppVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  ::clear_to_size((dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                   *)this,new_num_buckets);
  sVar2 = ht->num_buckets;
  ppVar4 = ht->table;
  ppVar1 = ppVar4 + sVar2;
  if (sVar2 != 0) {
    lVar5 = sVar2 << 3;
    do {
      if (((ht->key_info).empty_key != ppVar4->first) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey != ppVar4->first)) break;
      ppVar4 = ppVar4 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
  if (ppVar4 != ppVar1) {
    lVar5 = *(long *)(this + 0x38);
    lVar3 = *(long *)(this + 0x48);
    do {
      uVar6 = lVar5 - 1U & (long)ppVar4->first;
      if (*(int *)(this + 0x24) != *(int *)(lVar3 + uVar6 * 8)) {
        lVar7 = 1;
        do {
          uVar6 = uVar6 + lVar7 & lVar5 - 1U;
          lVar7 = lVar7 + 1;
        } while (*(int *)(this + 0x24) != *(int *)(lVar3 + uVar6 * 8));
      }
      *(int *)(lVar3 + uVar6 * 8) = ppVar4->first;
      *(undefined4 *)(lVar3 + 4 + uVar6 * 8) = 0;
      *(int *)(lVar3 + 4 + uVar6 * 8) = (ppVar4->second)._i;
      A::move_ctor = A::move_ctor + 1;
      *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
      ppVar4 = ppVar4 + 1;
      if (ppVar4 != ppVar1) {
        do {
          if (((ht->key_info).empty_key != ppVar4->first) &&
             (ht->num_deleted == 0 || (ht->key_info).delkey != ppVar4->first)) break;
          ppVar4 = ppVar4 + 1;
        } while (ppVar4 != ppVar1);
      }
    } while (ppVar4 != ppVar1);
  }
  *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
  return;
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }